

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.cc
# Opt level: O1

void __thiscall sentencepiece::ModelInterface::InitializePieces(ModelInterface *this)

{
  Status *this_00;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  Type *pTVar5;
  long *plVar6;
  undefined1 *puVar7;
  size_t *psVar8;
  size_t sVar9;
  PrefixMatcher *this_01;
  char *pcVar10;
  int iVar11;
  ModelProto *pMVar12;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var13;
  int iVar14;
  int iVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>,_bool>
  pVar19;
  pair<std::_Rb_tree_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool> pVar20;
  _Bit_iterator _Var21;
  string_view piece;
  string_view error_message;
  string_view error_message_00;
  string_view error_message_01;
  string_view error_message_02;
  string_view error_message_03;
  string_view error_message_04;
  string_view error_message_05;
  vector<bool,_std::allocator<bool>_> byte_found;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  user_defined_symbols;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  undefined1 local_e0 [24];
  undefined1 local_c8 [32];
  Status *local_a8;
  double dStack_a0;
  vector<bool,_std::allocator<bool>_> local_98;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_70;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_68;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  
  p_Var13 = &(this->pieces_)._M_h;
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(p_Var13);
  local_70 = &(this->reserved_id_map_)._M_h;
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(local_70);
  this->unk_id_ = -1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_len = local_f0._M_len & 0xffffffffffffff00;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_98,0x100,(bool *)&local_f0,(allocator_type *)local_c8);
  pMVar12 = this->model_proto_;
  if ((pMVar12->pieces_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    dVar16 = 0.0;
    local_a8 = (Status *)0x0;
    dStack_a0 = 0.0;
  }
  else {
    iVar14 = 0;
    iVar15 = 0;
    iVar11 = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
                         (&(pMVar12->pieces_).super_RepeatedPtrFieldBase,iVar11);
      if (((uint)pTVar5->type_ < 6) && ((0x32U >> (pTVar5->type_ & 0x1fU) & 1) != 0)) {
        iVar14 = iVar14 + 1;
      }
      else {
        iVar15 = iVar15 + 1;
      }
      iVar11 = iVar11 + 1;
      pMVar12 = this->model_proto_;
    } while (iVar11 < (pMVar12->pieces_).super_RepeatedPtrFieldBase.current_size_);
    auVar17._8_4_ = iVar14 >> 0x1f;
    auVar17._0_8_ = (long)iVar14;
    auVar17._12_4_ = 0x45300000;
    dVar16 = (auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar14) - 4503599627370496.0);
    auVar18._8_4_ = iVar15 >> 0x1f;
    auVar18._0_8_ = (long)iVar15;
    auVar18._12_4_ = 0x45300000;
    dStack_a0 = auVar18._8_8_ - 1.9342813113834067e+25;
    local_a8 = (Status *)(dStack_a0 + ((double)CONCAT44(0x43300000,iVar15) - 4503599627370496.0));
  }
  dVar16 = ceil(dVar16 / (double)(this->pieces_)._M_h._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash(p_Var13,(long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16);
  dVar16 = ceil((double)local_a8 /
                (double)(this->reserved_id_map_)._M_h._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash(local_70,(long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16);
  pMVar12 = this->model_proto_;
  if (0 < (pMVar12->pieces_).super_RepeatedPtrFieldBase.current_size_) {
    local_a8 = &this->status_;
    iVar11 = 0;
    local_68 = p_Var13;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
                         (&(pMVar12->pieces_).super_RepeatedPtrFieldBase,iVar11);
      plVar6 = (long *)((ulong)(pTVar5->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      p_Var1 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)plVar6[1];
      if (p_Var1 == (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)0x0) {
        error_message_01._M_str = "piece must not be empty.";
        error_message_01._M_len = 0x18;
        util::Status::Status((Status *)&local_f0,kInternal,error_message_01);
        util::Status::operator=(local_a8,(Status *)&local_f0);
        goto LAB_001c00ae;
      }
      if ((5 < (uint)pTVar5->type_) ||
         (local_c8._0_8_ = p_Var13, (0x32U >> (pTVar5->type_ & 0x1fU) & 1) == 0)) {
        local_c8._0_8_ = local_70;
      }
      local_f0._M_str = (char *)*plVar6;
      local_e0._0_4_ = iVar11;
      local_f0._M_len = (size_t)p_Var1;
      pVar19 = std::
               _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::
               _M_insert<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,true>>>>
                         ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)local_c8._0_8_,&local_f0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8);
      pcVar10 = pVar19._8_8_;
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        plVar6 = (long *)((ulong)(pTVar5->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        lVar2 = *plVar6;
        local_f0._M_len = (size_t)local_e0;
        std::__cxx11::string::_M_construct<char*>((string *)&local_f0,lVar2,plVar6[1] + lVar2);
        std::__cxx11::string::append((char *)&local_f0);
        sVar3 = local_f0._M_len;
        sVar9 = strlen((char *)local_f0._M_len);
        error_message_02._M_str = (char *)sVar3;
        error_message_02._M_len = sVar9;
        util::Status::Status((Status *)local_c8,kInternal,error_message_02);
        util::Status::operator=(local_a8,(Status *)local_c8);
        util::Status::~Status((Status *)local_c8);
        local_c8._16_8_ = local_e0._0_8_;
        p_Var13 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_f0._M_len;
        if ((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)local_f0._M_len !=
            (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)local_e0) {
LAB_001c0144:
          operator_delete(p_Var13,local_c8._16_8_ + 1);
        }
        goto LAB_001c014c;
      }
      if (pTVar5->type_ == 4) {
        plVar6 = (long *)((ulong)(pTVar5->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        local_f0._M_str = (char *)*plVar6;
        local_f0._M_len = plVar6[1];
        pVar20 = std::
                 _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                 ::_M_insert_unique<std::basic_string_view<char,std::char_traits<char>>>
                           ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                             *)&local_60,&local_f0);
        pcVar10 = pVar20._8_8_;
      }
      if (pTVar5->type_ == 6) {
        puVar7 = (undefined1 *)this->model_proto_->trainer_spec_;
        if ((TrainerSpec *)puVar7 == (TrainerSpec *)0x0) {
          puVar7 = _TrainerSpec_default_instance_;
        }
        if (((TrainerSpec *)puVar7)->byte_fallback_ == false) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,"byte piece ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(pTVar5->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          plVar6 = (long *)std::__cxx11::string::append(local_c8);
          p_Var13 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(plVar6 + 2);
          if ((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)*plVar6 == p_Var13) {
            local_e0._0_8_ = p_Var13->_M_buckets;
            local_e0._8_8_ = plVar6[3];
            local_f0._M_len = (size_t)local_e0;
          }
          else {
            local_e0._0_8_ = p_Var13->_M_buckets;
            local_f0._M_len = (size_t)*plVar6;
          }
          sVar3 = local_f0._M_len;
          local_f0._M_str = (char *)plVar6[1];
          *plVar6 = (long)p_Var13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          sVar9 = strlen((char *)local_f0._M_len);
          error_message_05._M_str = (char *)sVar3;
          error_message_05._M_len = sVar9;
          util::Status::Status((Status *)(local_e0 + 0x10),kInternal,error_message_05);
          util::Status::operator=(local_a8,(Status *)(local_e0 + 0x10));
          util::Status::~Status((Status *)(local_e0 + 0x10));
          if ((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_f0._M_len !=
              (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_e0) {
            operator_delete((void *)local_f0._M_len,local_e0._0_8_ + 1);
          }
          p_Var13 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_c8._0_8_;
          if ((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_c8._0_8_ !=
              (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(local_c8 + 0x10)) goto LAB_001c0144;
          goto LAB_001c014c;
        }
        psVar8 = (size_t *)((ulong)(pTVar5->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        piece._M_str = pcVar10;
        piece._M_len = *psVar8;
        uVar4 = PieceToByte((sentencepiece *)psVar8[1],piece);
        if ((int)uVar4 < 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,"byte piece ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(pTVar5->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          plVar6 = (long *)std::__cxx11::string::append((char *)local_c8);
          local_f0._M_len = (size_t)local_e0;
          p_Var13 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(plVar6 + 2);
          if ((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)*plVar6 == p_Var13) {
            local_e0._0_8_ = p_Var13->_M_buckets;
            local_e0._8_8_ = plVar6[3];
          }
          else {
            local_e0._0_8_ = p_Var13->_M_buckets;
            local_f0._M_len = (size_t)*plVar6;
          }
          sVar3 = local_f0._M_len;
          local_f0._M_str = (char *)plVar6[1];
          *plVar6 = (long)p_Var13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          sVar9 = strlen((char *)local_f0._M_len);
          this_00 = (Status *)(local_e0 + 0x10);
          error_message._M_str = (char *)sVar3;
          error_message._M_len = sVar9;
          util::Status::Status(this_00,kInternal,error_message);
          util::Status::operator=(local_a8,this_00);
          util::Status::~Status(this_00);
          if ((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_f0._M_len !=
              (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_e0) {
            operator_delete((void *)local_f0._M_len,local_e0._0_8_ + 1);
          }
          if ((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_c8._0_8_ !=
              (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
        }
        else {
          local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar4 >> 6] =
               local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar4 >> 6] | 1L << ((byte)uVar4 & 0x3f);
        }
        p_Var13 = local_68;
        if ((int)uVar4 < 0) goto LAB_001c014c;
      }
      else if (pTVar5->type_ == 2) {
        if (-1 < this->unk_id_) {
          error_message_04._M_str = "unk is already defined.";
          error_message_04._M_len = 0x17;
          util::Status::Status((Status *)&local_f0,kInternal,error_message_04);
          util::Status::operator=(local_a8,(Status *)&local_f0);
          goto LAB_001c00ae;
        }
        this->unk_id_ = iVar11;
      }
      iVar11 = iVar11 + 1;
      pMVar12 = this->model_proto_;
    } while (iVar11 < (pMVar12->pieces_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (this->unk_id_ == -1) {
    error_message_00._M_str = "unk is not defined.";
    error_message_00._M_len = 0x13;
    util::Status::Status((Status *)&local_f0,kInternal,error_message_00);
    util::Status::operator=(&this->status_,(Status *)&local_f0);
LAB_001c00ae:
    util::Status::~Status((Status *)&local_f0);
  }
  else {
    puVar7 = (undefined1 *)this->model_proto_->trainer_spec_;
    if ((TrainerSpec *)puVar7 == (TrainerSpec *)0x0) {
      puVar7 = _TrainerSpec_default_instance_;
    }
    if (((TrainerSpec *)puVar7)->byte_fallback_ == true) {
      local_f0._M_len = local_f0._M_len & 0xffffffffffffff00;
      _Var21 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                         (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                          local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                          local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
      if ((_Var21.super__Bit_iterator_base._M_p !=
           local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p) ||
         (_Var21.super__Bit_iterator_base._M_offset !=
          local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset)) {
        error_message_03._M_str = "there are not 256 byte pieces although `byte_fallback` is true.";
        error_message_03._M_len = 0x3f;
        util::Status::Status((Status *)&local_f0,kInternal,error_message_03);
        util::Status::operator=(&this->status_,(Status *)&local_f0);
        goto LAB_001c00ae;
      }
    }
    this_01 = (PrefixMatcher *)operator_new(8);
    normalizer::PrefixMatcher::PrefixMatcher
              (this_01,(set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)&local_60);
    std::
    __uniq_ptr_impl<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
    ::reset((__uniq_ptr_impl<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
             *)&this->matcher_,this_01);
  }
LAB_001c014c:
  if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void ModelInterface::InitializePieces() {
  pieces_.clear();
  reserved_id_map_.clear();
  unk_id_ = -1;

  std::set<absl::string_view> user_defined_symbols;
  std::vector<bool> byte_found(256, false);

  int pieces_size = 0;
  int reserved_id_map_size = 0;
  for (int i = 0; i < model_proto_->pieces_size(); ++i) {
    const auto &sp = model_proto_->pieces(i);
    const bool is_normal_piece =
        (sp.type() == ModelProto::SentencePiece::NORMAL ||
         sp.type() == ModelProto::SentencePiece::USER_DEFINED ||
         sp.type() == ModelProto::SentencePiece::UNUSED);
    if (is_normal_piece) {
      ++pieces_size;
    } else {
      ++reserved_id_map_size;
    }
  }
  pieces_.reserve(pieces_size);
  reserved_id_map_.reserve(reserved_id_map_size);

  for (int i = 0; i < model_proto_->pieces_size(); ++i) {
    const auto &sp = model_proto_->pieces(i);
    if (sp.piece().empty()) {
      status_ = util::InternalError("piece must not be empty.");
      return;
    }

    const bool is_normal_piece =
        (sp.type() == ModelProto::SentencePiece::NORMAL ||
         sp.type() == ModelProto::SentencePiece::USER_DEFINED ||
         sp.type() == ModelProto::SentencePiece::UNUSED);
    if (!port::InsertIfNotPresent(
            is_normal_piece ? &pieces_ : &reserved_id_map_, sp.piece(), i)) {
      status_ = util::InternalError(sp.piece() + " is already defined.");
      return;
    }

    if (sp.type() == ModelProto::SentencePiece::USER_DEFINED) {
      user_defined_symbols.insert(sp.piece());
    }

    if (sp.type() == ModelProto::SentencePiece::UNKNOWN) {
      if (unk_id_ >= 0) {
        status_ = util::InternalError("unk is already defined.");
        return;
      }
      unk_id_ = i;
    }

    if (sp.type() == ModelProto::SentencePiece::BYTE) {
      if (!model_proto_->trainer_spec().byte_fallback()) {
        status_ =
            util::InternalError("byte piece " + sp.piece() +
                                " is found although `byte_fallback` is false.");
        return;
      }
      const int byte = PieceToByte(sp.piece());
      if (0 <= byte && byte < 256) {
        byte_found[byte] = true;
      } else {
        status_ =
            util::InternalError("byte piece " + sp.piece() + " is invalid.");
        return;
      }
    }
  }

  if (unk_id_ == -1) {
    status_ = util::InternalError("unk is not defined.");
    return;
  }

  if (model_proto_->trainer_spec().byte_fallback()) {
    // Checks that there are 256 byte pieces.
    if (std::find(byte_found.begin(), byte_found.end(), false) !=
        byte_found.end()) {
      status_ = util::InternalError(
          "there are not 256 byte pieces although `byte_fallback` is true.");
      return;
    }
  }

  matcher_ = std::make_unique<normalizer::PrefixMatcher>(user_defined_symbols);
}